

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_stream::
read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  int val;
  bool bVar1;
  size_type sVar2;
  value_type *pvVar3;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *p_Var4;
  error_category *peVar5;
  char *__str;
  const_reference pvVar6;
  char in_R8B;
  string_view sVar7;
  string_view last;
  string_view last_00;
  string_view last_01;
  string_view last_02;
  string_view last_03;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_540;
  i2p_stream *local_528;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:383:5),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_520;
  mutable_buffer local_500;
  vector<char,_std::allocator<char>_> local_4f0;
  vector<char,_std::allocator<char>_> local_4d8;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_4c0;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_4a8;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_490;
  undefined1 local_478 [8];
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  char *local_2f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_2a8;
  undefined1 local_288 [8];
  string_view value;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_258;
  undefined1 local_238 [8];
  string_view name;
  int result;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  char *local_1f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1e0;
  size_t local_1c0;
  size_t local_1b8;
  char *local_1b0;
  size_t local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  char *local_190;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_180;
  undefined1 local_160 [8];
  string_view token;
  string_view remaining;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 local_c0 [8];
  string_view expect2;
  string_view expect1;
  error_code invalid_response;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_78;
  i2p_stream *local_60;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:227:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_58;
  mutable_buffer local_38;
  int local_24;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *p_Stack_20;
  int read_pos;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *h_local;
  error_code *e_local;
  i2p_stream *this_local;
  
  p_Stack_20 = h;
  h_local = (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
             *)e;
  e_local = (error_code *)this;
  bVar1 = libtorrent::aux::proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    sVar2 = ::std::vector<char,_std::allocator<char>_>::size
                      (&(this->m_buffer).super_vector<char,_std::allocator<char>_>);
    local_24 = (int)sVar2;
    pvVar3 = libtorrent::aux::
             container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                       (&this->m_buffer,local_24 + -1);
    if (*pvVar3 == '\n') {
      pvVar3 = libtorrent::aux::
               container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                         (&this->m_buffer,local_24 + -1);
      *pvVar3 = '\0';
      if (this->m_command == cmd_incoming) {
        pvVar3 = libtorrent::aux::
                 container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                           (&this->m_buffer,0);
        ::std::__cxx11::string::operator=((string *)&this->m_dest,pvVar3);
        ::std::
        _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
        ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                      *)h,(error_code *)h_local);
        memset(&invalid_response.cat_,0,0x18);
        ::std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&invalid_response.cat_);
        ::std::vector<char,_std::allocator<char>_>::swap
                  ((vector<char,_std::allocator<char>_> *)&invalid_response.cat_,
                   &(this->m_buffer).super_vector<char,_std::allocator<char>_>);
        ::std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&invalid_response.cat_);
      }
      else {
        peVar5 = i2p_category();
        boost::system::error_code::error_code((error_code *)&expect1._M_str,1,peVar5);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&expect2._M_str);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
        switch(this->m_state) {
        case read_hello_response:
          sVar7 = literals::operator____sv("HELLO",5);
          local_d0 = (char *)sVar7._M_len;
          expect2._M_str = local_d0;
          local_c8 = sVar7._M_str;
          expect1._M_len = (size_t)local_c8;
          sVar7 = literals::operator____sv("REPLY",5);
          local_e0 = (char *)sVar7._M_len;
          local_c0 = (undefined1  [8])local_e0;
          local_d8 = sVar7._M_str;
          expect2._M_len = (size_t)local_d8;
          break;
        case read_connect_response:
        case read_accept_response:
          sVar7 = literals::operator____sv("STREAM",6);
          local_f0 = (char *)sVar7._M_len;
          expect2._M_str = local_f0;
          local_e8 = sVar7._M_str;
          expect1._M_len = (size_t)local_e8;
          sVar7 = literals::operator____sv("STATUS",6);
          local_100 = (char *)sVar7._M_len;
          local_c0 = (undefined1  [8])local_100;
          local_f8 = sVar7._M_str;
          expect2._M_len = (size_t)local_f8;
          break;
        case read_session_create_response:
          sVar7 = literals::operator____sv("SESSION",7);
          local_110 = (char *)sVar7._M_len;
          expect2._M_str = local_110;
          local_108 = sVar7._M_str;
          expect1._M_len = (size_t)local_108;
          sVar7 = literals::operator____sv("STATUS",6);
          local_120 = (char *)sVar7._M_len;
          local_c0 = (undefined1  [8])local_120;
          local_118 = sVar7._M_str;
          expect2._M_len = (size_t)local_118;
          break;
        case read_name_lookup_response:
          sVar7 = literals::operator____sv("NAMING",6);
          local_130 = (char *)sVar7._M_len;
          expect2._M_str = local_130;
          local_128 = sVar7._M_str;
          expect1._M_len = (size_t)local_128;
          sVar7 = literals::operator____sv("REPLY",5);
          remaining._M_str = (char *)sVar7._M_len;
          local_c0 = (undefined1  [8])remaining._M_str;
          local_138 = sVar7._M_str;
          expect2._M_len = (size_t)local_138;
        }
        __str = ::std::vector<char,_std::allocator<char>_>::data
                          (&(this->m_buffer).super_vector<char,_std::allocator<char>_>);
        sVar2 = ::std::vector<char,_std::allocator<char>_>::size
                          (&(this->m_buffer).super_vector<char,_std::allocator<char>_>);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&token._M_str,__str,sVar2 - 1
                  );
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_160);
        local_190 = token._M_str;
        last._M_str = (char *)0x20;
        last._M_len = remaining._M_len;
        libtorrent::aux::split_string(&local_180,(aux *)token._M_str,last,in_R8B);
        ::std::
        tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_1a0,(basic_string_view<char,_std::char_traits<char>_> *)local_160);
        ::std::
        tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
        ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                     *)&local_1a0,
                    (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&local_180);
        bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&expect2._M_str);
        if (!bVar1) {
          local_1b0 = expect2._M_str;
          local_1a8 = expect1._M_len;
          local_1c0 = (size_t)local_160;
          local_1b8 = token._M_len;
          __x_00._M_str = (char *)expect1._M_len;
          __x_00._M_len = (size_t)expect2._M_str;
          __y_11._M_str = (char *)token._M_len;
          __y_11._M_len = (size_t)local_160;
          bVar1 = ::std::operator!=(__x_00,__y_11);
          if (!bVar1) {
            local_1f0 = token._M_str;
            last_00._M_str = (char *)0x20;
            last_00._M_len = remaining._M_len;
            libtorrent::aux::split_string(&local_1e0,(aux *)token._M_str,last_00,in_R8B);
            ::std::
            tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_200,(basic_string_view<char,_std::char_traits<char>_> *)local_160);
            ::std::
            tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                         *)&local_200,
                        (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)&local_1e0);
            bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
            if ((!bVar1) &&
               (__x._M_str = (char *)expect2._M_len, __x._M_len = (size_t)local_c0,
               __y_10._M_str = (char *)token._M_len, __y_10._M_len = (size_t)local_160,
               bVar1 = ::std::operator!=(__x,__y_10), !bVar1)) {
              name._M_str._4_4_ = 0;
              while( true ) {
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_238);
                last_01._M_str = (char *)0x3d;
                last_01._M_len = remaining._M_len;
                libtorrent::aux::split_string(&local_258,(aux *)token._M_str,last_01,in_R8B);
                ::std::
                tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)&value._M_str,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_238);
                ::std::
                tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                             *)&value._M_str,
                            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)&local_258);
                bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_238);
                val = name._M_str._4_4_;
                if (bVar1) {
                  peVar5 = i2p_category();
                  boost::system::error_code::error_code((error_code *)local_478,val,peVar5);
                  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_478);
                  if (!bVar1) {
                    switch(this->m_state) {
                    case read_hello_response:
                      goto switchD_00605520_caseD_0;
                    case read_connect_response:
                    case read_session_create_response:
                    case read_name_lookup_response:
                      ::std::
                      _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                      ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                                    *)h,(error_code *)local_478);
                      memset(&local_4f0,0,0x18);
                      ::std::vector<char,_std::allocator<char>_>::vector(&local_4f0);
                      ::std::vector<char,_std::allocator<char>_>::swap
                                (&local_4f0,
                                 &(this->m_buffer).super_vector<char,_std::allocator<char>_>);
                      ::std::vector<char,_std::allocator<char>_>::~vector(&local_4f0);
                      return;
                    case read_accept_response:
                      this->m_command = cmd_incoming;
                      libtorrent::aux::
                      container_wrapper<char,int,std::vector<char,std::allocator<char>>>::
                      resize<int,void>((container_wrapper<char,int,std::vector<char,std::allocator<char>>>
                                        *)&this->m_buffer,1);
                      local_500 = boost::asio::buffer<char,std::allocator<char>>
                                            (&(this->m_buffer).
                                              super_vector<char,_std::allocator<char>_>);
                      p_Var4 = (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                                *)local_500.data_;
                      local_528 = this;
                      ::std::
                      _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      ::_Bind(&local_540,h);
                      libtorrent::aux::
                      wrap_allocator<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_2_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                                (&local_520,(aux *)local_528,(i2p_stream *)&local_540,p_Var4);
                      boost::asio::
                      async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_2_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                                ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                                  *)this,&local_500,&local_520,(type *)0x0);
                      return;
                    default:
                      return;
                    }
                  }
                  ::std::
                  _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                  ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                                *)h,(error_code *)local_478);
                  return;
                }
                ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_288);
                pvVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)
                                    &token._M_str,0);
                if (*pvVar6 == '\"') {
                  local_2b8 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &token._M_str,1,0xffffffffffffffff);
                  last_02._M_str = (char *)0x22;
                  last_02._M_len = (size_t)local_2b8._M_str;
                  libtorrent::aux::split_string(&local_2a8,(aux *)local_2b8._M_len,last_02,in_R8B);
                  ::std::
                  tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                            (&local_2c8,
                             (basic_string_view<char,_std::char_traits<char>_> *)local_288);
                  ::std::
                  tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                               *)&local_2c8,
                              (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                               *)&local_2a8);
                  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_288);
                  if (bVar1) {
                    libtorrent::aux::proxy_base::
                    handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                              (&this->super_proxy_base,(error_code *)&expect1._M_str,h);
                    return;
                  }
                  ::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_288,1);
                }
                else {
                  local_2f8 = token._M_str;
                  last_03._M_str = (char *)0x20;
                  last_03._M_len = remaining._M_len;
                  libtorrent::aux::split_string(&local_2e8,(aux *)token._M_str,last_03,in_R8B);
                  ::std::
                  tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                            (&local_308,
                             (basic_string_view<char,_std::char_traits<char>_> *)local_288);
                  ::std::
                  tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                               *)&local_308,
                              (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                               *)&local_2e8);
                }
                bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_288);
                if (bVar1) break;
                sVar7 = literals::operator____sv("RESULT",6);
                __y_09._M_str = (char *)name._M_len;
                __y_09._M_len = (size_t)local_238;
                bVar1 = ::std::operator==(sVar7,__y_09);
                if (bVar1) {
                  sVar7 = literals::operator____sv("OK",2);
                  __y_08._M_str = (char *)value._M_len;
                  __y_08._M_len = (size_t)local_288;
                  bVar1 = ::std::operator==(sVar7,__y_08);
                  if (bVar1) {
                    name._M_str._4_4_ = 0;
                  }
                  else {
                    sVar7 = literals::operator____sv("CANT_REACH_PEER",0xf);
                    __y_07._M_str = (char *)value._M_len;
                    __y_07._M_len = (size_t)local_288;
                    bVar1 = ::std::operator==(sVar7,__y_07);
                    if (bVar1) {
                      name._M_str._4_4_ = 2;
                    }
                    else {
                      sVar7 = literals::operator____sv("I2P_ERROR",9);
                      __y_06._M_str = (char *)value._M_len;
                      __y_06._M_len = (size_t)local_288;
                      bVar1 = ::std::operator==(sVar7,__y_06);
                      if (bVar1) {
                        name._M_str._4_4_ = 3;
                      }
                      else {
                        sVar7 = literals::operator____sv("INVALID_KEY",0xb);
                        __y_05._M_str = (char *)value._M_len;
                        __y_05._M_len = (size_t)local_288;
                        bVar1 = ::std::operator==(sVar7,__y_05);
                        if (bVar1) {
                          name._M_str._4_4_ = 4;
                        }
                        else {
                          sVar7 = literals::operator____sv("INVALID_ID",10);
                          __y_04._M_str = (char *)value._M_len;
                          __y_04._M_len = (size_t)local_288;
                          bVar1 = ::std::operator==(sVar7,__y_04);
                          if (bVar1) {
                            name._M_str._4_4_ = 5;
                          }
                          else {
                            sVar7 = literals::operator____sv("TIMEOUT",7);
                            __y_03._M_str = (char *)value._M_len;
                            __y_03._M_len = (size_t)local_288;
                            bVar1 = ::std::operator==(sVar7,__y_03);
                            if (bVar1) {
                              name._M_str._4_4_ = 6;
                            }
                            else {
                              sVar7 = literals::operator____sv("KEY_NOT_FOUND",0xd);
                              __y_02._M_str = (char *)value._M_len;
                              __y_02._M_len = (size_t)local_288;
                              bVar1 = ::std::operator==(sVar7,__y_02);
                              if (bVar1) {
                                name._M_str._4_4_ = 7;
                              }
                              else {
                                sVar7 = literals::operator____sv("DUPLICATED_ID",0xd);
                                __y_01._M_str = (char *)value._M_len;
                                __y_01._M_len = (size_t)local_288;
                                bVar1 = ::std::operator==(sVar7,__y_01);
                                if (bVar1) {
                                  name._M_str._4_4_ = 8;
                                }
                                else {
                                  name._M_str._4_4_ = 9;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  sVar7 = literals::operator____sv("VALUE",5);
                  __y_00._M_str = (char *)name._M_len;
                  __y_00._M_len = (size_t)local_238;
                  bVar1 = ::std::operator==(sVar7,__y_00);
                  if (bVar1) {
                    ::std::__cxx11::string::operator=
                              ((string *)&this->m_name_lookup,
                               (basic_string_view<char,_std::char_traits<char>_> *)local_288);
                  }
                  else {
                    sVar7 = literals::operator____sv("DESTINATION",0xb);
                    ec.cat_ = (error_category *)local_238;
                    __y._M_str = (char *)name._M_len;
                    __y._M_len = (size_t)local_238;
                    bVar1 = ::std::operator==(sVar7,__y);
                    if (bVar1) {
                      ::std::__cxx11::string::operator=
                                ((string *)&this->m_dest,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_288);
                    }
                  }
                }
              }
              libtorrent::aux::proxy_base::
              handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                        (&this->super_proxy_base,(error_code *)&expect1._M_str,h);
              return;
            }
            libtorrent::aux::proxy_base::
            handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                      (&this->super_proxy_base,(error_code *)&expect1._M_str,h);
            return;
          }
        }
        libtorrent::aux::proxy_base::
        handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                  (&this->super_proxy_base,(error_code *)&expect1._M_str,h);
      }
    }
    else {
      libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>::
      resize<int,void>((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)
                       &this->m_buffer,local_24 + 1);
      pvVar3 = libtorrent::aux::
               container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator[]
                         (&this->m_buffer,local_24);
      local_38 = boost::asio::buffer(pvVar3,1);
      p_Var4 = (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)local_38.data_;
      local_60 = this;
      ::std::
      _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::_Bind(&local_78,h);
      libtorrent::aux::
      wrap_allocator<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&local_58,(aux *)local_60,(i2p_stream *)&local_78,p_Var4);
      boost::asio::
      async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                  *)this,&local_38,&local_58,(type *)0x0);
    }
  }
  return;
switchD_00605520_caseD_0:
  switch(this->m_command) {
  case cmd_none:
  case cmd_name_lookup:
  case cmd_incoming:
    ::std::
    _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
    ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                  *)h,(error_code *)local_478);
    memset(&local_4d8,0,0x18);
    ::std::vector<char,_std::allocator<char>_>::vector(&local_4d8);
    ::std::vector<char,_std::allocator<char>_>::swap
              (&local_4d8,&(this->m_buffer).super_vector<char,_std::allocator<char>_>);
    ::std::vector<char,_std::allocator<char>_>::~vector(&local_4d8);
    return;
  case cmd_create_session:
    ::std::
    _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::_Bind(&local_490,h);
    send_session_create<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (this,&local_490);
    return;
  case cmd_connect:
    ::std::
    _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::_Bind(&local_4c0,h);
    send_connect<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (this,&local_4c0);
    return;
  case cmd_accept:
    ::std::
    _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::_Bind(&local_4a8,h);
    send_accept<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (this,&local_4a8);
    return;
  default:
    return;
  }
}

Assistant:

void read_line(error_code const& e, Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		COMPLETE_ASYNC("i2p_stream::read_line");
		if (handle_error(e, h)) return;

		auto const read_pos = int(m_buffer.size());

		// look for \n which means end of the response
		if (m_buffer[read_pos - 1] != '\n')
		{
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			// read another byte from the socket
			m_buffer.resize(read_pos + 1);
			async_read(m_sock, boost::asio::buffer(&m_buffer[read_pos], 1), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				read_line(ec, std::move(hn));
			}, std::move(h)));
			return;
		}
		m_buffer[read_pos - 1] = 0;

		if (m_command == cmd_incoming)
		{
			// this is the line containing the destination
			// of the incoming connection in an accept call
			m_dest = &m_buffer[0];
			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		error_code invalid_response(i2p_error::parse_failed
			, i2p_category());

		string_view expect1;
		string_view expect2;

		switch (m_state)
		{
			case read_hello_response:
				expect1 = "HELLO"_sv;
				expect2 = "REPLY"_sv;
				break;
			case read_connect_response:
			case read_accept_response:
				expect1 = "STREAM"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_session_create_response:
				expect1 = "SESSION"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_name_lookup_response:
				expect1 = "NAMING"_sv;
				expect2 = "REPLY"_sv;
				break;
		}

		TORRENT_ASSERT(m_buffer[int(m_buffer.size()) - 1] == '\0');
		string_view remaining(m_buffer.data(), m_buffer.size() - 1);
		string_view token;

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect1.empty() || expect1 != token)
		{ handle_error(invalid_response, h); return; }

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect2.empty() || expect2 != token)
		{ handle_error(invalid_response, h); return; }

		int result = 0;

		for(;;)
		{
			string_view name;
			std::tie(name, remaining) = aux::split_string(remaining, '=');
			if (name.empty()) break;
			string_view value;
			if (remaining[0] == '"')
			{
				std::tie(value, remaining) = aux::split_string(remaining.substr(1), '"');
				if (value.empty()) { handle_error(invalid_response, h); return; }
				value.remove_suffix(1);
			}
			else
			{
				std::tie(value, remaining) = aux::split_string(remaining, ' ');
			}
			if (value.empty()) { handle_error(invalid_response, h); return; }

			if ("RESULT"_sv == name)
			{
				if ("OK"_sv == value)
					result = i2p_error::no_error;
				else if ("CANT_REACH_PEER"_sv == value)
					result = i2p_error::cant_reach_peer;
				else if ("I2P_ERROR"_sv == value)
					result = i2p_error::i2p_error;
				else if ("INVALID_KEY"_sv == value)
					result = i2p_error::invalid_key;
				else if ("INVALID_ID"_sv == value)
					result = i2p_error::invalid_id;
				else if ("TIMEOUT"_sv == value)
					result = i2p_error::timeout;
				else if ("KEY_NOT_FOUND"_sv == value)
					result = i2p_error::key_not_found;
				else if ("DUPLICATED_ID"_sv == value)
					result = i2p_error::duplicated_id;
				else
					result = i2p_error::num_errors; // unknown error
			}
			/*else if ("MESSAGE" == name)
			{
			}
			else if ("VERSION"_sv == name)
			{
			}*/
			else if ("VALUE"_sv == name)
			{
				m_name_lookup = value;
			}
			else if ("DESTINATION"_sv == name)
			{
				m_dest = value;
			}
		}

		error_code ec(result, i2p_category());
		if (ec)
		{
			std::forward<Handler>(h)(ec);
			return;
		}

		switch (m_state)
		{
		case read_hello_response:
			switch (m_command)
			{
				case cmd_create_session:
					send_session_create(std::move(h));
					break;
				case cmd_accept:
					send_accept(std::move(h));
					break;
				case cmd_connect:
					send_connect(std::move(h));
					break;
				case cmd_none:
				case cmd_name_lookup:
				case cmd_incoming:
					std::forward<Handler>(h)(ec);
					std::vector<char>().swap(m_buffer);
			}
			break;
		case read_connect_response:
		case read_session_create_response:
		case read_name_lookup_response:
			std::forward<Handler>(h)(ec);
			std::vector<char>().swap(m_buffer);
			break;
		case read_accept_response:
			// the SAM bridge is waiting for an incoming
			// connection.
			// wait for one more line containing
			// the destination of the remote peer
			m_command = cmd_incoming;
			m_buffer.resize(1);
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			async_read(m_sock, boost::asio::buffer(m_buffer), aux::wrap_allocator(
				[this](error_code const& err, std::size_t, Handler hn) {
					read_line(err, std::move(hn));
				}, std::move(h)));
			break;
		}
	}